

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

xmlSchemaValPtr xmlSchemaNewStringValue(xmlSchemaValType type,xmlChar *value)

{
  xmlSchemaValPtr pxVar1;
  
  if (type == XML_SCHEMAS_STRING) {
    pxVar1 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
    if (pxVar1 == (xmlSchemaValPtr)0x0) {
      pxVar1 = (xmlSchemaValPtr)0x0;
    }
    else {
      *(undefined8 *)pxVar1 = 0;
      pxVar1->next = (_xmlSchemaVal *)0x0;
      (pxVar1->value).decimal.lo = 0;
      (pxVar1->value).decimal.mi = 0;
      (pxVar1->value).decimal.hi = 0;
      *(undefined8 *)((long)&pxVar1->value + 0x18) = 0;
      pxVar1->type = XML_SCHEMAS_STRING;
      (pxVar1->value).qname.name = value;
    }
    return pxVar1;
  }
  return (xmlSchemaValPtr)0x0;
}

Assistant:

xmlSchemaValPtr
xmlSchemaNewStringValue(xmlSchemaValType type,
			const xmlChar *value)
{
    xmlSchemaValPtr val;

    if (type != XML_SCHEMAS_STRING)
	return(NULL);
    val = (xmlSchemaValPtr) xmlMalloc(sizeof(xmlSchemaVal));
    if (val == NULL) {
	return(NULL);
    }
    memset(val, 0, sizeof(xmlSchemaVal));
    val->type = type;
    val->value.str = (xmlChar *) value;
    return(val);
}